

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_memory_manager.cpp
# Opt level: O3

void __thiscall
duckdb::TemporaryMemoryManager::UpdateConfiguration
          (TemporaryMemoryManager *this,ClientContext *context)

{
  int iVar1;
  int32_t val;
  type db;
  BufferManager *pBVar2;
  TaskScheduler *this_00;
  undefined4 extraout_var;
  ulong uVar3;
  unsigned_long uVar4;
  ConnectionManager *this_01;
  idx_t iVar5;
  undefined4 extraout_var_00;
  undefined1 auVar6 [16];
  double dVar7;
  
  db = shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&context->db);
  pBVar2 = BufferManager::GetBufferManager(db);
  this_00 = TaskScheduler::GetScheduler(context);
  iVar1 = (*pBVar2->_vptr_BufferManager[0xb])(pBVar2);
  auVar6._4_4_ = extraout_var;
  auVar6._0_4_ = iVar1;
  auVar6._8_4_ = extraout_var;
  auVar6._12_4_ = 0x45300000;
  dVar7 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 0.9;
  uVar3 = (ulong)dVar7;
  this->memory_limit = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
  iVar1 = (*pBVar2->_vptr_BufferManager[0x1d])(pBVar2);
  this->has_temporary_directory = SUB41(iVar1,0);
  val = TaskScheduler::NumberOfThreads(this_00);
  uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  this->num_threads = uVar4;
  this_01 = ConnectionManager::Get(context);
  iVar5 = ConnectionManager::GetConnectionCount(this_01);
  this->num_connections = iVar5;
  iVar1 = (*pBVar2->_vptr_BufferManager[0x1f])(pBVar2);
  iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x10))
                    ((long *)CONCAT44(extraout_var_00,iVar1));
  this->query_max_memory = iVar5;
  return;
}

Assistant:

void TemporaryMemoryManager::UpdateConfiguration(ClientContext &context) {
	auto &buffer_manager = BufferManager::GetBufferManager(context);
	auto &task_scheduler = TaskScheduler::GetScheduler(context);

	memory_limit =
	    LossyNumericCast<idx_t>(MAXIMUM_MEMORY_LIMIT_RATIO * static_cast<double>(buffer_manager.GetMaxMemory()));
	has_temporary_directory = buffer_manager.HasTemporaryDirectory();
	num_threads = NumericCast<idx_t>(task_scheduler.NumberOfThreads());
	num_connections = ConnectionManager::Get(context).GetConnectionCount();
	query_max_memory = buffer_manager.GetQueryMaxMemory();
}